

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::ValueExpressionBase::requireLValueImpl
          (ValueExpressionBase *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix,
          EvalContext *customEvalContext)

{
  string_view *psVar1;
  SourceRange *pSVar2;
  SourceRange varRange;
  bool bVar3;
  Diagnostic *pDVar4;
  ConstantValue **this_00;
  Type *this_01;
  NetSymbol *pNVar5;
  VariableSymbol *context_00;
  ModportPortSymbol *pMVar6;
  ValueExpressionBase *this_02;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  Diagnostic *diag_1;
  bitmask<slang::ast::AssignFlags> local_b4;
  SourceLocation local_b0;
  SourceLocation local_a8;
  undefined4 local_9c;
  bitmask<slang::ast::ASTFlags> local_98;
  SourceLocation local_90;
  SourceLocation local_88;
  SourceLocation local_80;
  undefined4 local_74;
  size_t local_70;
  char *local_68;
  SourceLocation local_60;
  undefined4 local_54;
  Diagnostic *local_50;
  Diagnostic *diag;
  EvalContext *local_40;
  EvalContext *customEvalContext_local;
  Expression *longestStaticPrefix_local;
  ASTContext *context_local;
  ValueExpressionBase *this_local;
  SourceLocation SStack_18;
  bitmask<slang::ast::AssignFlags> flags_local;
  SourceLocation location_local;
  
  local_40 = customEvalContext;
  customEvalContext_local = (EvalContext *)longestStaticPrefix;
  longestStaticPrefix_local = (Expression *)context;
  context_local = (ASTContext *)this;
  this_local._4_4_ = flags.m_bits;
  SStack_18 = location;
  bVar3 = SourceLocation::operator_cast_to_bool(&stack0xffffffffffffffe8);
  if (!bVar3) {
    diag = (Diagnostic *)SourceRange::start(&(this->super_Expression).sourceRange);
    SStack_18 = (SourceLocation)diag;
  }
  if ((((this->symbol->super_Symbol).kind == Parameter) ||
      ((this->symbol->super_Symbol).kind == EnumValue)) ||
     ((this->symbol->super_Symbol).kind == Specparam)) {
    local_54 = 0x340007;
    local_60 = SStack_18;
    pDVar4 = ASTContext::addDiag((ASTContext *)longestStaticPrefix_local,(DiagCode)0x340007,
                                 SStack_18);
    psVar1 = &(this->symbol->super_Symbol).name;
    local_70 = psVar1->_M_len;
    local_68 = (this->symbol->super_Symbol).name._M_str;
    local_50 = Diagnostic::operator<<(pDVar4,*psVar1);
    local_74 = 0x40001;
    local_80 = (this->symbol->super_Symbol).location;
    Diagnostic::addNote(local_50,(DiagCode)0x40001,local_80);
    pSVar2 = &(this->super_Expression).sourceRange;
    local_90 = pSVar2->startLoc;
    local_88 = (this->super_Expression).sourceRange.endLoc;
    Diagnostic::operator<<(local_50,*pSVar2);
    return false;
  }
  this_00 = &longestStaticPrefix_local->constant;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_98,NonProcedural);
  bVar3 = bitmask<slang::ast::ASTFlags>::has((bitmask<slang::ast::ASTFlags> *)this_00,&local_98);
  if (bVar3) {
    this_01 = ValueSymbol::getType(this->symbol);
    bVar3 = Type::isCHandle(this_01);
    if (bVar3) {
      local_9c = 0x90007;
      pSVar2 = &(this->super_Expression).sourceRange;
      local_b0 = pSVar2->startLoc;
      local_a8 = (this->super_Expression).sourceRange.endLoc;
      ASTContext::addDiag((ASTContext *)longestStaticPrefix_local,(DiagCode)0x90007,*pSVar2);
      return false;
    }
    bVar3 = false;
    if ((this->symbol->super_Symbol).kind == Net) {
      pNVar5 = Symbol::as<slang::ast::NetSymbol>(&this->symbol->super_Symbol);
      bVar3 = false;
      if (pNVar5->netType->netKind == UWire) {
        bitmask<slang::ast::AssignFlags>::bitmask(&local_b4,InOutPort);
        bVar3 = bitmask<slang::ast::AssignFlags>::has
                          ((bitmask<slang::ast::AssignFlags> *)((long)&this_local + 4),&local_b4);
      }
    }
    if (bVar3 != false) {
      pDVar4 = ASTContext::addDiag((ASTContext *)longestStaticPrefix_local,(DiagCode)0x4e0007,
                                   (this->super_Expression).sourceRange);
      Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
      return false;
    }
    in_stack_fffffffffffffe97 = 0;
  }
  else if ((this->symbol->super_Symbol).kind == Net) {
    ASTContext::addDiag((ASTContext *)longestStaticPrefix_local,(DiagCode)0xa0007,
                        (this->super_Expression).sourceRange);
    return false;
  }
  bVar3 = VariableSymbol::isKind((this->symbol->super_Symbol).kind);
  if (bVar3) {
    this_02 = (ValueExpressionBase *)longestStaticPrefix_local;
    context_00 = Symbol::as<slang::ast::VariableSymbol>(&this->symbol->super_Symbol);
    varRange.endLoc._0_7_ = in_stack_fffffffffffffe90;
    varRange.startLoc = (SourceLocation)this_02;
    varRange.endLoc._7_1_ = in_stack_fffffffffffffe97;
    bVar3 = checkVariableAssignment
                      (this_02,(ASTContext *)context_00,(VariableSymbol *)(ulong)this_local._4_4_,
                       (bitmask<slang::ast::AssignFlags>)SStack_18._0_4_,
                       (this->super_Expression).sourceRange.startLoc,varRange);
    if (!bVar3) {
      return false;
    }
  }
  else if (((this->symbol->super_Symbol).kind == ModportPort) &&
          (pMVar6 = Symbol::as<slang::ast::ModportPortSymbol>(&this->symbol->super_Symbol),
          pMVar6->direction == In)) {
    pDVar4 = ASTContext::addDiag((ASTContext *)longestStaticPrefix_local,(DiagCode)0x520007,
                                 (this->super_Expression).sourceRange);
    Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
    Diagnostic::addNote(pDVar4,(DiagCode)0x40001,(this->symbol->super_Symbol).location);
    return false;
  }
  if (customEvalContext_local == (EvalContext *)0x0) {
    customEvalContext_local = (EvalContext *)this;
  }
  ASTContext::addDriver
            ((ASTContext *)longestStaticPrefix_local,this->symbol,
             (Expression *)customEvalContext_local,this_local._4_4_,local_40);
  return true;
}

Assistant:

bool ValueExpressionBase::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                            bitmask<AssignFlags> flags,
                                            const Expression* longestStaticPrefix,
                                            EvalContext* customEvalContext) const {
    if (!location)
        location = sourceRange.start();

    if (symbol.kind == SymbolKind::Parameter || symbol.kind == SymbolKind::EnumValue ||
        symbol.kind == SymbolKind::Specparam) {
        auto& diag = context.addDiag(diag::CantModifyConst, location) << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        diag << sourceRange;
        return false;
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        // chandles can only be assigned in procedural contexts.
        if (symbol.getType().isCHandle()) {
            context.addDiag(diag::AssignToCHandle, sourceRange);
            return false;
        }

        if (symbol.kind == SymbolKind::Net &&
            symbol.as<NetSymbol>().netType.netKind == NetType::UWire &&
            flags.has(AssignFlags::InOutPort)) {
            context.addDiag(diag::InOutUWireConn, sourceRange) << symbol.name;
            return false;
        }
    }
    else {
        // Nets can't be assigned in procedural contexts.
        if (symbol.kind == SymbolKind::Net) {
            context.addDiag(diag::AssignToNet, sourceRange);
            return false;
        }
    }

    if (VariableSymbol::isKind(symbol.kind)) {
        if (!checkVariableAssignment(context, symbol.as<VariableSymbol>(), flags, location,
                                     sourceRange)) {
            return false;
        }
    }
    else if (symbol.kind == SymbolKind::ModportPort) {
        if (symbol.as<ModportPortSymbol>().direction == ArgumentDirection::In) {
            auto& diag = context.addDiag(diag::InputPortAssign, sourceRange);
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return false;
        }
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;
    context.addDriver(symbol, *longestStaticPrefix, flags, customEvalContext);

    return true;
}